

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cc
# Opt level: O1

void __thiscall
gvr::Mesh::addGLObjects(Mesh *this,vector<gvr::GLObject_*,_std::allocator<gvr::GLObject_*>_> *list)

{
  return;
}

Assistant:

void Mesh::addGLObjects(std::vector<GLObject *> &list)
{
#ifdef INCLUDE_GL
  // check if there are unused vertices

  std::vector<bool> vused;
  int n=getUsedVertices(vused);

  // split into point cloud and mesh

  if (getVertexCount() == n)
  {
    list.push_back(new GLMesh(*this));
  }
  else
  {
    if (n > 0)
    {
      std::vector<bool> tused(getTriangleCount(), true);
      Mesh m(*this, vused, tused);
      list.push_back(new GLMesh(m));
    }

    if (getVertexCount()-n > 0)
    {
      for (int i=0; i<getVertexCount(); i++)
      {
        vused[i]=!vused[i];
      }

      PointCloud p(*this, vused);
      list.push_back(new GLPointCloud(p));
    }
  }

#else
  assert(false);
#endif
}